

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.hpp
# Opt level: O0

stream_source<char> * __thiscall
jsoncons::stream_source<char>::operator=(stream_source<char> *this,stream_source<char> *other)

{
  char *pcVar1;
  char *pcVar2;
  basic_streambuf<char,_std::char_traits<char>_> *pbVar3;
  stream_source<char> *in_RSI;
  stream_source<char> *in_RDI;
  stream_source<char> *in_stack_fffffffffffffe30;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  value_type *pvVar4;
  stream_source<char> *in_stack_fffffffffffffe60;
  stream_source<char> *in_stack_ffffffffffffffe8;
  
  if ((stream_source<char> *)in_RSI->stream_ptr_ == in_RSI) {
    in_RDI->stream_ptr_ = (basic_istream<char,_std::char_traits<char>_> *)in_RDI;
    pbVar3 = (basic_streambuf<char,_std::char_traits<char>_> *)std::ios::rdbuf();
    in_RDI->sbuf_ = pbVar3;
    in_RDI->position_ = 0;
    pcVar1 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x441023);
    in_RDI->buffer_data_ = pcVar1;
    in_RDI->buffer_length_ = 0;
  }
  else {
    in_RDI->stream_ptr_ = in_RSI->stream_ptr_;
    in_RDI->sbuf_ = in_RSI->sbuf_;
    in_RDI->position_ = in_RSI->position_;
    std::vector<char,_std::allocator<char>_>::operator=(in_stack_fffffffffffffe40,&in_RDI->buffer_);
    pcVar1 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x440f55);
    pvVar4 = in_RSI->buffer_data_;
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x440f7a);
    in_RDI->buffer_data_ = pcVar1 + ((long)pvVar4 - (long)pcVar2);
    in_RDI->buffer_length_ = in_RSI->buffer_length_;
    stream_source(in_stack_fffffffffffffe60);
    operator=(in_RSI,in_stack_ffffffffffffffe8);
    ~stream_source(in_stack_fffffffffffffe30);
  }
  return in_RDI;
}

Assistant:

stream_source& operator=(stream_source&& other) noexcept
        {
            if (other.stream_ptr_ != &other.null_is_)
            {
                stream_ptr_ = other.stream_ptr_;
                sbuf_ = other.sbuf_;
                position_ = other.position_;
                buffer_ = std::move(other.buffer_);
                buffer_data_ = buffer_.data() + (other.buffer_data_ - other.buffer_.data());
                buffer_length_ =  other.buffer_length_;
                other = stream_source();
            }
            else
            {
                stream_ptr_ = &null_is_;
                sbuf_ = null_is_.rdbuf();
                position_ = 0;
                buffer_data_ = buffer_.data();
                buffer_length_ =  0;
            }
            return *this;
        }